

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int asn1_get_sequence_of_cb(void *ctx,int tag,uchar *start,size_t len)

{
  void *pvVar1;
  int *local_40;
  mbedtls_asn1_sequence *cur;
  asn1_get_sequence_of_cb_ctx_t *cb_ctx;
  size_t len_local;
  uchar *start_local;
  int tag_local;
  void *ctx_local;
  
  local_40 = *(int **)((long)ctx + 8);
  if (*(long *)(local_40 + 4) != 0) {
    pvVar1 = calloc(1,0x20);
    *(void **)(local_40 + 6) = pvVar1;
    if (*(long *)(local_40 + 6) == 0) {
      return -0x6a;
    }
    local_40 = *(int **)(local_40 + 6);
  }
  *(uchar **)(local_40 + 4) = start;
  *(size_t *)(local_40 + 2) = len;
  *local_40 = tag;
  *(int **)((long)ctx + 8) = local_40;
  return 0;
}

Assistant:

static int asn1_get_sequence_of_cb(void *ctx,
                                   int tag,
                                   unsigned char *start,
                                   size_t len)
{
    asn1_get_sequence_of_cb_ctx_t *cb_ctx =
        (asn1_get_sequence_of_cb_ctx_t *) ctx;
    mbedtls_asn1_sequence *cur =
        cb_ctx->cur;

    if (cur->buf.p != NULL) {
        cur->next =
            mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

        if (cur->next == NULL) {
            return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        }

        cur = cur->next;
    }

    cur->buf.p = start;
    cur->buf.len = len;
    cur->buf.tag = tag;

    cb_ctx->cur = cur;
    return 0;
}